

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecimalDatatypeValidator.cpp
# Opt level: O2

XMLCh * __thiscall
xercesc_4_0::DecimalDatatypeValidator::getCanonicalRepresentation
          (DecimalDatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  CanRepGroup CVar1;
  XMLCh *pXVar2;
  undefined7 in_register_00000009;
  
  if (memMgr == (MemoryManager *)0x0) {
    memMgr = (this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
             super_DatatypeValidator.fMemoryManager;
  }
  if ((int)CONCAT71(in_register_00000009,toValidate) != 0) {
    (*(this->super_AbstractNumericValidator).super_AbstractNumericFacetValidator.
      super_DatatypeValidator.super_XSerializable._vptr_XSerializable[0x11])
              (this,rawData,0,0,memMgr);
  }
  CVar1 = DatatypeValidatorFactory::getCanRepGroup((DatatypeValidator *)this);
  if (CVar1 - Decimal_Derived_signed < 3) {
    pXVar2 = XMLBigInteger::getCanonicalRepresentation(rawData,memMgr,CVar1 == Decimal_Derived_npi);
    return pXVar2;
  }
  if (CVar1 == Decimal) {
    pXVar2 = XMLBigDecimal::getCanonicalRepresentation(rawData,memMgr);
    return pXVar2;
  }
  pXVar2 = XMLString::replicate(rawData,memMgr);
  return pXVar2;
}

Assistant:

const XMLCh* DecimalDatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                                 ,      MemoryManager* const memMgr
                                                                 ,      bool                 toValidate) const
{
    MemoryManager* toUse = memMgr? memMgr : fMemoryManager;
    DecimalDatatypeValidator* temp = (DecimalDatatypeValidator*) this;

    if (toValidate)
    {
        try
        {
            temp->checkContent(rawData, 0, false, toUse);
        }
        catch (...)
        {
            return 0;
        }
    }

    // XMLBigInteger::getCanonicalRepresentation and
    // XMLBigDecimal::getCanonicalRepresentation will handle exceptional cases
    XMLCanRepGroup::CanRepGroup dvType = DatatypeValidatorFactory::getCanRepGroup(temp);

    if ((dvType == XMLCanRepGroup::Decimal_Derived_signed)   ||
        (dvType == XMLCanRepGroup::Decimal_Derived_unsigned) ||
        (dvType == XMLCanRepGroup::Decimal_Derived_npi)        )
    {
        return XMLBigInteger::getCanonicalRepresentation(rawData, toUse, dvType == XMLCanRepGroup::Decimal_Derived_npi);
    }
    else if (dvType == XMLCanRepGroup::Decimal)
    {
        return XMLBigDecimal::getCanonicalRepresentation(rawData, toUse);
    }
    else //in case?
    {
        return XMLString::replicate(rawData, toUse);
    }

}